

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

Value * system_function_print(Value *context_value,TupleValue *parameter_values)

{
  ulong uVar1;
  Value *pVVar2;
  size_t i;
  ulong uVar3;
  
  uVar1 = parameter_values->length;
  if (uVar1 != 0) {
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      pVVar2 = convert_to_string_value(parameter_values->items[uVar3]);
      printf("%s",*(undefined8 *)(pVVar2 + 1));
      if (uVar3 != parameter_values->length - 1) {
        putchar(0x20);
      }
      free_value(pVVar2);
      uVar1 = parameter_values->length;
    }
    putchar(10);
  }
  pVVar2 = new_null_value();
  return pVVar2;
}

Assistant:

Value *system_function_print(Value *context_value, TupleValue *parameter_values) {
  if (parameter_values->length == 0) {
    return new_null_value();
  }

  for (size_t i = 0; i < parameter_values->length; i++) {
    StringValue *string_value = (StringValue *) convert_to_string_value(parameter_values->items[i]);

    printf("%s", string_value->string_value);

    if (i != parameter_values->length - 1) {
      printf(" ");
    }

    free_value((Value *) string_value);
  }

  printf("\n");

  return new_null_value();
}